

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O1

QString * Html::spanZebra(QString *__return_storage_ptr__,QStringList *text,QString *color,
                         QString *background,QString *altBackground)

{
  QString *pQVar1;
  long lVar2;
  ulong uVar3;
  QByteArrayView QVar4;
  QStringList result;
  QString local_70;
  QArrayDataPointer<QString> local_58;
  QString *local_40;
  QString *local_38;
  
  local_58.d = (Data *)0x0;
  local_58.ptr = (QString *)0x0;
  local_58.size = 0;
  local_40 = __return_storage_ptr__;
  local_38 = altBackground;
  if (0 < (text->d).size) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      pQVar1 = local_38;
      if ((uVar3 & 1) == 0) {
        pQVar1 = background;
      }
      span(&local_70,(QString *)((long)&(((text->d).ptr)->d).d + lVar2),color,pQVar1);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_58,local_58.size,&local_70);
      if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
        }
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
    } while ((long)uVar3 < (text->d).size);
  }
  QVar4.m_data = (storage_type *)0x0;
  QVar4.m_size = (qsizetype)&local_70;
  QString::fromUtf8(QVar4);
  pQVar1 = local_40;
  if (local_70.d.ptr == (char16_t *)0x0) {
    local_70.d.ptr = (char16_t *)&QString::_empty;
  }
  QtPrivate::QStringList_join((QList *)local_40,(QChar *)&local_58,(longlong)local_70.d.ptr);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
  return pQVar1;
}

Assistant:

QString Html::spanZebra(const QStringList& text, const QString& color, const QString& background, const QString& altBackground)
{
    QStringList result;
    for(int i=0;i<text.size();i++) {
        result << span(text[i],color,i % 2 ? altBackground : background);
    }
    return result.join("");
}